

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseables.cpp
# Opt level: O1

TString * anon_unknown.dwarf_125bedc::AppendTypeName
                    (TString *s,char *argOrder,char *argType,int dim0,int dim1)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char __c;
  uint uVar8;
  byte bVar9;
  char cVar10;
  char *pcVar11;
  bool bVar12;
  byte local_44;
  
  bVar1 = *argOrder;
  bVar12 = true;
  if ((((bVar1 != 0x25) && (bVar1 != 0x40)) && ((bVar1 & 0xfd) != 0x24)) &&
     ((bVar1 != 0x2a && (bVar1 != 0x7e)))) {
    bVar12 = (bVar1 & 0xfd) == 0x21;
  }
  bVar2 = *argType;
  uVar7 = dim1;
  uVar8 = dim0;
  bVar9 = bVar2;
  if ((bVar1 != 0x5e) &&
     (((uVar8 = dim1, uVar7 = dim0, bVar12 || (bVar1 == 0x5d)) || (bVar1 == 0x5b)))) {
    if (bVar2 == 0x46) {
      bVar9 = 0x54;
    }
    else if (bVar2 == 0x49) {
      bVar9 = 0x69;
    }
    else if (bVar2 == 0x55) {
      bVar9 = 0x75;
    }
  }
  if (bVar9 < 0x69) {
    switch(bVar9) {
    case 0x42:
      pcVar11 = "bool";
      break;
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
switchD_00432f45_caseD_43:
      pcVar11 = "UNKNOWN_TYPE";
      break;
    case 0x44:
      pcVar11 = "double";
      break;
    case 0x46:
      pcVar11 = "float";
      break;
    case 0x49:
      pcVar11 = "int";
      break;
    case 0x4c:
      pcVar11 = "int64_t";
      break;
    case 0x4d:
      pcVar11 = "uint64_t";
      break;
    case 0x53:
      pcVar11 = "sampler";
      break;
    case 0x54:
      goto switchD_00432f45_caseD_54;
    case 0x55:
      pcVar11 = "uint";
      break;
    default:
      if (bVar9 != 0x2d) goto switchD_00432f45_caseD_43;
      pcVar11 = "void";
    }
  }
  else {
    if (bVar9 != 0x69) {
      if (bVar9 == 0x73) {
        pcVar11 = "SamplerComparisonState";
        goto LAB_0043300d;
      }
      if (bVar9 != 0x75) goto switchD_00432f45_caseD_43;
    }
switchD_00432f45_caseD_54:
    pcVar11 = "Texture";
    if ((bVar1 & 0xfd) == 0x21 || bVar1 == 0x7e) {
      pcVar11 = "RWTexture";
    }
    pcVar5 = "Buffer";
    if (bVar1 != 0x2a && bVar1 != 0x7e) {
      pcVar5 = pcVar11;
    }
    pcVar6 = "SubpassInput";
    if (bVar1 != 0x5b && bVar1 != 0x5d) {
      pcVar6 = pcVar5;
    }
    pcVar11 = "RWBuffer";
    if (bVar1 != 0x7e) {
      pcVar11 = pcVar6;
    }
  }
LAB_0043300d:
  cVar3 = argOrder[bVar1 == 0x5e];
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar11);
  if (bVar1 == 0x5d) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,"MS");
  }
  local_44 = (byte)(0x20000009 >> (bVar1 - 0x23 & 0x1f));
  pcVar11 = argOrder + (bVar1 == 0x5e);
  do {
    cVar10 = *pcVar11;
    uVar4 = 0;
    if ((cVar10 == '\0') || (uVar4 = 0, cVar10 == ',')) break;
    uVar4 = (int)cVar10 - 0x30;
    pcVar11 = pcVar11 + 1;
  } while (9 < uVar4);
  if (uVar4 != 0) {
    uVar8 = uVar4;
    uVar7 = uVar4;
  }
  cVar10 = (char)uVar7 + '0';
  if ((bool)(~bVar12 & (bVar2 & 0xdf) != 0x53)) {
    if ((cVar3 == 'V') || (cVar3 == 'M')) {
      pcVar11 = "UNKNOWN_DIMENSION";
      if (uVar7 - 5 < 0xfffffffc) goto LAB_004331d6;
      __c = cVar10;
      if (cVar3 != 'V') {
        if (cVar3 != 'M') goto LAB_00433179;
        if (uVar8 - 5 < 0xfffffffc) goto LAB_004331d6;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        push_back(s,cVar10);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        push_back(s,'x');
        __c = (char)uVar8 + '0';
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      push_back(s,__c);
    }
  }
  else if (((!(bool)(~bVar12 & cVar3 != 'V')) && (bVar1 != 0x2a)) && (bVar1 != 0x7e)) {
    switch(uVar7) {
    case 1:
      pcVar11 = "1D";
      break;
    case 2:
      pcVar11 = "2D";
      if (bVar1 == 0x5d || (bVar1 & 0xfd) == 0x24) {
        pcVar11 = "2DMS";
      }
      break;
    case 3:
      pcVar11 = "3D";
      break;
    case 4:
      pcVar11 = "Cube";
      if (bVar9 == 0x53) {
        pcVar11 = "CUBE";
      }
      break;
    default:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(s,"UNKNOWN_SAMPLER");
      goto LAB_00433179;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,pcVar11);
  }
LAB_00433179:
  if (((byte)(bVar1 - 0x23) < 0x1e & local_44) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (s,"Array");
  }
  if (bVar9 == 0x54) {
    pcVar11 = "<float";
  }
  else if (bVar9 == 0x69) {
    pcVar11 = "<int";
  }
  else {
    if (bVar9 != 0x75) {
      return s;
    }
    pcVar11 = "<uint";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar11);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  push_back(s,cVar10);
  pcVar11 = ">";
LAB_004331d6:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
            (s,pcVar11);
  return s;
}

Assistant:

glslang::TString& AppendTypeName(glslang::TString& s, const char* argOrder, const char* argType, int dim0, int dim1)
{
    const bool isTranspose = (argOrder[0] == '^');
    const bool isTexture   = IsTextureType(argOrder[0]);
    const bool isArrayed   = IsArrayed(argOrder[0]);
    const bool isSampler   = IsSamplerType(argType[0]);
    const bool isMS        = IsMS(argOrder[0]);
    const bool isBuffer    = IsBuffer(argOrder[0]);
    const bool isImage     = IsImage(argOrder[0]);
    const bool isSubpass   = IsSubpassInput(argOrder[0]);

    char type  = *argType;

    if (isTranspose) {  // Take transpose of matrix dimensions
        std::swap(dim0, dim1);
    } else if (isTexture || isSubpass) {
        if (type == 'F')       // map base type to texture of that type.
            type = 'T';        // e.g, int -> itexture, uint -> utexture, etc.
        else if (type == 'I')
            type = 'i';
        else if (type == 'U')
            type = 'u';
    }

    if (isTranspose)
        ++argOrder;

    char order = *argOrder;

    switch (type) {
    case '-': s += "void";                                break;
    case 'F': s += "float";                               break;
    case 'D': s += "double";                              break;
    case 'I': s += "int";                                 break;
    case 'U': s += "uint";                                break;
    case 'L': s += "int64_t";                             break;
    case 'M': s += "uint64_t";                            break;
    case 'B': s += "bool";                                break;
    case 'S': s += "sampler";                             break;
    case 's': s += "SamplerComparisonState";              break;
    case 'T': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage  ? "RWTexture" : "Texture");  break;
    case 'i': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage ? "RWTexture" : "Texture");   break;
    case 'u': s += ((isBuffer && isImage) ? "RWBuffer" :
                    isSubpass ? "SubpassInput" :
                    isBuffer ? "Buffer" :
                    isImage ? "RWTexture" : "Texture");   break;
    default:  s += "UNKNOWN_TYPE";                        break;
    }

    if (isSubpass && isMS)
        s += "MS";

    // handle fixed vector sizes, such as float3, and only ever 3.
    const int fixedVecSize = FixedVecSize(argOrder);
    if (fixedVecSize != 0)
        dim0 = dim1 = fixedVecSize;

    const char dim0Char = ('0' + char(dim0));
    const char dim1Char = ('0' + char(dim1));

    // Add sampler dimensions
    if (isSampler || isTexture) {
        if ((order == 'V' || isTexture) && !isBuffer) {
            switch (dim0) {
            case 1: s += "1D";                   break;
            case 2: s += (isMS ? "2DMS" : "2D"); break;
            case 3: s += "3D";                   break;
            case 4: s += (type == 'S'? "CUBE" : "Cube"); break;
            default: s += "UNKNOWN_SAMPLER";     break;
            }
        }
    } else {
        // Non-sampler type:
        // verify dimensions
        if (((order == 'V' || order == 'M') && (dim0 < 1 || dim0 > 4)) ||
            (order == 'M' && (dim1 < 1 || dim1 > 4))) {
            s += "UNKNOWN_DIMENSION";
            return s;
        }

        switch (order) {
        case '-': break;  // no dimensions for voids
        case 'S': break;  // no dimensions on scalars
        case 'V':
            s += dim0Char;
            break;
        case 'M':
            s += dim0Char;
            s += 'x';
            s += dim1Char;
            break;
        default:
            break;
        }
    }

    // handle arrayed textures
    if (isArrayed)
        s += "Array";

    switch (type) {
    case 'i': s += "<int";   s += dim0Char; s += ">"; break;
    case 'u': s += "<uint";  s += dim0Char; s += ">"; break;
    case 'T': s += "<float"; s += dim0Char; s += ">"; break;
    default: break;
    }

    return s;
}